

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O3

void __thiscall
piksel::Graphics::image
          (Graphics *this,Image *img,float dx,float dy,float dWidth,float dHeight,float sx,float sy,
          float sWidth,float sHeight)

{
  undefined4 uVar1;
  undefined4 uVar2;
  stack<piksel::State,_std::deque<piksel::State,_std::allocator<piksel::State>_>_> *psVar3;
  col_type cVar4;
  _Elt_pointer pSVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 in_XMM4_Db;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar9 [16];
  
  push(this);
  psVar3 = this->stateStack;
  pSVar5 = (psVar3->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar5 == (psVar3->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar5 = (psVar3->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  if (pSVar5[-1].shaderIrrelevantState.tint == false) {
    pSVar5[-1].shaderRelevantState.tintColor.field_0.field_0.x = 1.0;
    pSVar5[-1].shaderRelevantState.tintColor.field_0.field_0.y = 1.0;
    pSVar5[-1].shaderRelevantState.tintColor.field_0.field_0.z = 1.0;
    pSVar5[-1].shaderRelevantState.tintColor.field_0.field_0.w = 1.0;
  }
  pSVar5[-1].shaderIrrelevantState.rectMode = pSVar5[-1].shaderIrrelevantState.imageMode;
  (*glad_glActiveTexture)(img->_index % 8 + 0x84c0);
  (*glad_glBindTexture)(0xde1,img->_texture);
  uVar1 = img->width;
  uVar2 = img->height;
  fVar6 = (float)(int)uVar2;
  auVar10._4_4_ = in_XMM4_Db;
  auVar10._0_4_ = sx;
  auVar10._8_4_ = in_XMM4_Db;
  auVar10._12_4_ = fVar6;
  auVar9._8_8_ = auVar10._8_8_;
  auVar9._4_4_ = (fVar6 - sy) - sHeight;
  auVar9._0_4_ = sx;
  auVar11._4_4_ = fVar6;
  auVar11._0_4_ = (float)(int)uVar1;
  auVar11._8_8_ = 0;
  auVar11 = divps(auVar9,auVar11);
  fVar6 = auVar11._0_4_ * 0.0;
  fVar7 = auVar11._4_4_ * 0.0;
  fVar8 = fVar7 + fVar6 + 0.0;
  *(long *)&pSVar5[-1].shaderRelevantState.textureMatrix.value[0].field_0 =
       SUB168(ZEXT416(0x3f800000),0);
  *(undefined8 *)((long)&pSVar5[-1].shaderRelevantState.textureMatrix.value[0].field_0 + 8) = 0;
  *(undefined8 *)&pSVar5[-1].shaderRelevantState.textureMatrix.value[1].field_0 = 0x3f80000000000000
  ;
  *(undefined8 *)((long)&pSVar5[-1].shaderRelevantState.textureMatrix.value[1].field_0 + 8) = 0;
  *(undefined8 *)&pSVar5[-1].shaderRelevantState.textureMatrix.value[2].field_0 = 0;
  *(long *)((long)&pSVar5[-1].shaderRelevantState.textureMatrix.value[2].field_0 + 8) =
       SUB168(ZEXT416(0x3f800000),0);
  *(ulong *)&pSVar5[-1].shaderRelevantState.textureMatrix.value[3].field_0 =
       CONCAT44(fVar6 + auVar11._4_4_ + 0.0,fVar7 + auVar11._0_4_ + 0.0);
  *(ulong *)((long)&pSVar5[-1].shaderRelevantState.textureMatrix.value[3].field_0 + 8) =
       CONCAT44(fVar8 + 1.0,fVar8);
  fVar8 = sWidth / (float)img->width;
  fVar12 = sHeight / (float)img->height;
  fVar7 = fVar8 * 0.0;
  fVar6 = fVar12 * 0.0;
  pSVar5[-1].shaderRelevantState.textureMatrix.value[0].field_0.field_0.x = fVar8;
  pSVar5[-1].shaderRelevantState.textureMatrix.value[0].field_0.field_0.y = fVar7;
  pSVar5[-1].shaderRelevantState.textureMatrix.value[0].field_0.field_0.z = fVar7;
  pSVar5[-1].shaderRelevantState.textureMatrix.value[0].field_0.field_0.w = fVar7;
  pSVar5[-1].shaderRelevantState.textureMatrix.value[1].field_0.field_0.x = fVar6;
  pSVar5[-1].shaderRelevantState.textureMatrix.value[1].field_0.field_0.y = fVar12;
  pSVar5[-1].shaderRelevantState.textureMatrix.value[1].field_0.field_0.z = fVar6;
  pSVar5[-1].shaderRelevantState.textureMatrix.value[1].field_0.field_0.w = fVar6;
  cVar4.field_0.field_0.w = 0.0;
  cVar4.field_0._0_12_ = ZEXT412(0x3f800000) << 0x40;
  pSVar5[-1].shaderRelevantState.textureMatrix.value[2].field_0 = cVar4.field_0;
  pSVar5[-1].shaderRelevantState.textureIndex = (float)(img->_index % 8);
  _rect(this,dx,dy,dWidth,dHeight);
  pop(this);
  return;
}

Assistant:

void Graphics::image(Image& img, float dx, float dy, float dWidth, float dHeight, float sx, float sy, float sWidth, float sHeight) {
    push();
    State& state = peek();
    if (!state.shaderIrrelevantState.tint) {
        state.shaderRelevantState.tintColor = glm::vec4(1.0f);
    }
    state.shaderIrrelevantState.rectMode = state.shaderIrrelevantState.imageMode;
    glActiveTexture(GL_TEXTURE0 + (img._index % 8));
	glBindTexture(GL_TEXTURE_2D, img._texture);
	state.shaderRelevantState.textureMatrix = glm::translate(glm::mat4(1.0f), glm::vec3(sx / img.width, (img.height - sy - sHeight) / img.height, 0.0f));
	state.shaderRelevantState.textureMatrix = glm::scale(state.shaderRelevantState.textureMatrix, glm::vec3(sWidth / img.width, sHeight / img.height, 1.0f));
    // state.shaderRelevantState.textureMatrix = glm::mat4(1.0f); // for debug
    state.shaderRelevantState.textureIndex = img._index % 8;
    _rect(dx, dy, dWidth, dHeight);
    pop();
}